

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

bigint * __thiscall fmt::v7::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  sbyte sVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  
  if (shift < 0) {
    __assert_fail("shift >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x538,"bigint &fmt::detail::bigint::operator<<=(int)");
  }
  this->exp_ = this->exp_ + ((uint)shift >> 5);
  if ((shift & 0x1fU) != 0) {
    sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
    if (sVar2 == 0) {
      uVar5 = 0;
    }
    else {
      puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar4 = (sbyte)(shift & 0x1fU);
      sVar6 = 0;
      uVar7 = 0;
      do {
        uVar1 = puVar3[sVar6];
        uVar5 = uVar1 >> (0x20U - sVar4 & 0x1f);
        puVar3[sVar6] = (uVar1 << sVar4) + uVar7;
        sVar6 = sVar6 + 1;
        uVar7 = uVar5;
      } while (sVar2 != sVar6);
    }
    if (uVar5 != 0) {
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < sVar2 + 1) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
      }
      puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
      (this->bigits_).super_buffer<unsigned_int>.size_ = sVar2 + 1;
      puVar3[sVar2] = uVar5;
    }
  }
  return this;
}

Assistant:

FMT_NOINLINE bigint& operator<<=(int shift) {
    assert(shift >= 0);
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }